

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpMeshHandler.c
# Opt level: O2

sbfBuffer_conflict sbfTcpMeshHandlerGetBuffer(sbfHandlerStream stream,size_t size)

{
  sbfBuffer_conflict psVar1;
  
  psVar1 = sbfBuffer_new((sbfPool)0x0,size);
  return psVar1;
}

Assistant:

static sbfBuffer
sbfTcpMeshHandlerGetBuffer (sbfHandlerStream stream, size_t size)
{
    return sbfBuffer_new (NULL, size);
}